

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall
gulcalc::writemode1output
          (gulcalc *this,int event_id,OASIS_FLOAT tiv,
          vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
          *gilv,bool correlated)

{
  iterator __position;
  gulSampleslevelRec gVar1;
  int iVar2;
  pointer pvVar3;
  vector<gulSampleslevelRec,std::allocator<gulSampleslevelRec>> *this_00;
  _Base_ptr p_Var4;
  pointer __k;
  ulong uVar5;
  _Base_ptr p_Var6;
  _Self __tmp;
  gulSampleslevelRec gg;
  map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  gxi;
  gulitemSampleslevel local_80;
  int local_70;
  OASIS_FLOAT local_6c;
  code *local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  local_60;
  
  local_70 = event_id;
  local_6c = tiv;
  if (this->alloc_rule_ == 2) {
    setmaxloss(this,gilv);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = split_tiv_classic;
  if (this->alloc_rule_ == 3) {
    local_68 = split_tiv_multiplicative;
  }
  pvVar3 = (gilv->
           super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((gilv->
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    uVar5 = 0;
    do {
      if ((uVar5 != (long)this->num_idx_ - 2U) || (uVar5 != (long)this->num_idx_ - 4U)) {
        (*local_68)(local_6c,pvVar3 + uVar5);
      }
      pvVar3 = (gilv->
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (__k = pvVar3[uVar5].super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          __k != *(pointer *)
                  ((long)&pvVar3[uVar5].
                          super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                          super__Vector_impl_data + 8); __k = __k + 1) {
        local_80.event_id = (int)uVar5 - this->num_idx_;
        local_80.item_id = (int)(float)__k->loss;
        this_00 = (vector<gulSampleslevelRec,std::allocator<gulSampleslevelRec>> *)
                  std::
                  map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                  ::operator[]((map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                                *)&local_60,&__k->item_id);
        __position._M_current = *(gulSampleslevelRec **)(this_00 + 8);
        if (__position._M_current == *(gulSampleslevelRec **)(this_00 + 0x10)) {
          std::vector<gulSampleslevelRec,std::allocator<gulSampleslevelRec>>::
          _M_realloc_insert<gulSampleslevelRec_const&>
                    (this_00,__position,(gulSampleslevelRec *)&local_80);
        }
        else {
          gVar1.loss = (OASIS_FLOAT)local_80.item_id;
          gVar1.sidx = local_80.event_id;
          *__position._M_current = gVar1;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        pvVar3 = (gilv->
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar5 = uVar5 + 1;
      pvVar3 = (gilv->
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)(((long)(gilv->
                                    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3)
                            * -0x5555555555555555));
  }
  iVar2 = local_70;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_80.event_id = iVar2;
      local_80.item_id = p_Var4[1]._M_color;
      for (p_Var6 = p_Var4[1]._M_parent; p_Var6 != p_Var4[1]._M_left;
          p_Var6 = (_Base_ptr)&p_Var6->_M_parent) {
        local_80.sidx = p_Var6->_M_color;
        local_80.loss = *(OASIS_FLOAT *)&p_Var6->field_0x4;
        if (correlated) {
          correlatedoutputgul(this,&local_80);
        }
        else {
          itemoutputgul(this,&local_80);
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void gulcalc::writemode1output(const int event_id, const OASIS_FLOAT tiv,
			       std::vector<std::vector<gulItemIDLoss>> &gilv,
			       const bool correlated=false) {

	// Set losses for alloc rule where
	// total peril loss = maximum subperil loss
	if (alloc_rule_ == 2) setmaxloss(gilv);

	std::map<int, std::vector<gulSampleslevelRec>> gxi;

    // select tiv split method depending on alloc_rule_
    void (*split_tiv)(std::vector<gulItemIDLoss> &, OASIS_FLOAT);
    if (alloc_rule_==3) split_tiv = &split_tiv_multiplicative;
    else split_tiv = &split_tiv_classic;
	// Check whether the sum of losses per sample exceed TIV
	// If so, split TIV in proportion to losses
	for (size_t i = 0; i < gilv.size(); i++) {

		if ((i != num_idx_ + std_dev_idx) ||
		    (i != num_idx_ + number_of_affected_risk_idx)) {
			split_tiv(gilv[i], tiv);
		}

		auto iter = gilv[i].begin();
		while (iter != gilv[i].end()) {

			gulSampleslevelRec gg;
			gg.sidx = i - num_idx_;
			gg.loss = iter->loss;

			gxi[iter->item_id].push_back(gg);
			iter++;

		}

	}

	// Output all items associated with current coverage ID
	// Output the rows here
	auto iter = gxi.begin();
	while (iter != gxi.end()) {
		gulitemSampleslevel g;
		g.event_id = event_id;
		g.item_id = iter->first;
		auto iter2 = iter->second.begin();
		while (iter2 != iter->second.end()) {
			g.sidx = iter2->sidx;
			g.loss = iter2->loss;
			if (correlated) correlatedoutputgul(g);
			else itemoutputgul(g);
			iter2++;
		}
		iter++;
	}

}